

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjio.cpp
# Opt level: O2

int SaveBinary(path *fname,aint start,aint length)

{
  int iVar1;
  FILE *__stream;
  string local_48;
  
  __stream = (FILE *)SJ_fopen(fname,"wb");
  if (__stream == (FILE *)0x0) {
    std::filesystem::__cxx11::path::string(&local_48,fname);
    Error("opening file for write",local_48._M_dataplus._M_p,FATAL);
    std::__cxx11::string::~string((string *)&local_48);
  }
  iVar1 = SaveRAM((FILE *)__stream,start,length);
  fclose(__stream);
  return iVar1;
}

Assistant:

int SaveBinary(const std::filesystem::path & fname, aint start, aint length) {
	FILE* ff;
	if (!FOPEN_ISOK(ff, fname, "wb")) Error("opening file for write", fname.string().c_str(), FATAL);
	int result = SaveRAM(ff, start, length);
	fclose(ff);
	return result;
}